

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void mbedtls_sha512(uchar *input,size_t ilen,uchar *output,int is384)

{
  undefined1 local_100 [8];
  mbedtls_sha512_context ctx;
  int is384_local;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx._212_4_ = is384;
  mbedtls_sha512_init((mbedtls_sha512_context *)local_100);
  mbedtls_sha512_starts((mbedtls_sha512_context *)local_100,ctx._212_4_);
  mbedtls_sha512_update((mbedtls_sha512_context *)local_100,input,ilen);
  mbedtls_sha512_finish((mbedtls_sha512_context *)local_100,output);
  mbedtls_sha512_free((mbedtls_sha512_context *)local_100);
  return;
}

Assistant:

void mbedtls_sha512( const unsigned char *input, size_t ilen,
             unsigned char output[64], int is384 )
{
    mbedtls_sha512_context ctx;

    mbedtls_sha512_init( &ctx );
    mbedtls_sha512_starts( &ctx, is384 );
    mbedtls_sha512_update( &ctx, input, ilen );
    mbedtls_sha512_finish( &ctx, output );
    mbedtls_sha512_free( &ctx );
}